

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

void __thiscall restincurl::Worker::Join(Worker *this)

{
  element_type *peVar1;
  int iVar2;
  undefined8 uVar3;
  shared_ptr<restincurl::Worker::WorkerThread> thd;
  element_type *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  anon_class_8_1_8991fb9c local_18;
  
  local_28 = (element_type *)0x0;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar2 == 0) {
    peVar1 = (this->thread_).
             super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    if ((peVar1 != (element_type *)0x0) && ((peVar1->thread_)._M_id._M_thread != 0)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_20,
                 &(this->thread_).
                  super___shared_ptr<restincurl::Worker::WorkerThread,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      local_28 = peVar1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    if (local_28 != (element_type *)0x0) {
      local_18.this = local_28;
      std::call_once<restincurl::Worker::WorkerThread::Join()const::_lambda()_1_>
                (&local_28->joined_,&local_18);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
    return;
  }
  uVar3 = std::__throw_system_error(iVar2);
  if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

void Join() const {
            decltype(thread_) thd;

            {
                lock_t lock(mutex_);
                if (thread_ && thread_->Joinable()) {
                    thd = thread_;
                }
            }

            if (thd) {
                thd->Join();
            }
        }